

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextengine.cpp
# Opt level: O0

QFixed __thiscall QTextEngine::width(QTextEngine *this,int from,int len)

{
  long in_FS_OFFSET;
  QFixed *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  QTextEngine *in_stack_00000010;
  QFixed w;
  QTextEngine *in_stack_00000148;
  QFixed local_c;
  anon_class_16_2_fd512de4 *innerFunc;
  
  innerFunc = *(anon_class_16_2_fd512de4 **)(in_FS_OFFSET + 0x28);
  itemize(in_stack_00000148);
  local_c.val = -0x55555556;
  QFixed::QFixed(&local_c,0);
  (anonymous_namespace)::textIterator<QTextEngine::width(int,int)const::__0>
            (in_stack_00000010,in_stack_0000000c,in_stack_00000008,unaff_retaddr,innerFunc);
  if (*(anon_class_16_2_fd512de4 **)(in_FS_OFFSET + 0x28) == innerFunc) {
    return (QFixed)local_c.val;
  }
  __stack_chk_fail();
}

Assistant:

QFixed QTextEngine::width(int from, int len) const
{
    itemize();

    QFixed w = 0;
//     qDebug("QTextEngine::width(from = %d, len = %d), numItems=%d, strleng=%d", from,  len, items.size(), string.length());
    textIterator(this, from, len, w, [this, &w](int glyphStart, int glyphEnd, const QScriptItem *si) {
        QGlyphLayout glyphs = this->shapedGlyphs(si);
        for (int j = glyphStart; j < glyphEnd; j++)
            w += glyphs.advances[j] * !glyphs.attributes[j].dontPrint;
    });
//     qDebug("   --> w= %d ", w);
    return w;
}